

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5600a9::Nrom_creation_works_with_correct_rom_sizes_Test::TestBody
          (Nrom_creation_works_with_correct_rom_sizes_Test *this)

{
  _Head_base<0UL,_n_e_s::core::IRom_*,_false> _Var1;
  undefined1 auVar2 [8];
  Mapper in_R8D;
  Mapper mapper;
  _Head_base<0UL,_n_e_s::core::IRom_*,_false> *val2;
  char *pcVar3;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> nrom;
  string bytes;
  AssertionResult gtest_ar;
  stringstream ss;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_350;
  AssertHelper local_348;
  _Head_base<0UL,_n_e_s::core::IRom_*,_false> local_340;
  string local_338;
  undefined1 local_318 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [7];
  ios_base local_298 [264];
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_338,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  std::__cxx11::stringstream::stringstream(local_190,(string *)&local_338,_S_out|_S_in);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&local_340,(istream *)local_190);
  local_350._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  val2 = &local_340;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>>
            ((internal *)local_318,"nullptr","nrom",&local_350._M_head_impl,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)val2);
  mapper = (Mapper)val2;
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_350);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x59,pcVar3);
    mapper = (Mapper)pcVar3;
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_350._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_350._M_head_impl + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            ((string *)local_318,(_anonymous_namespace_ *)0x2,'\x01','\0',mapper);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_338,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
  if (local_318 != (undefined1  [8])local_308) {
    operator_delete((void *)local_318,local_308[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_318,(string *)&local_338,_S_out|_S_in);
  std::__cxx11::stringstream::operator=(local_190,(stringstream *)local_318);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_318);
  std::ios_base::~ios_base(local_298);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)local_318,(istream *)local_190);
  auVar2 = local_318;
  _Var1._M_head_impl = local_340._M_head_impl;
  local_318 = (undefined1  [8])0x0;
  local_340._M_head_impl = (IRom *)auVar2;
  if (_Var1._M_head_impl != (IRom *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_IRom[1])();
  }
  if (local_318 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_318 + 8))();
  }
  local_350._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>>
            ((internal *)local_318,"nullptr","nrom",&local_350._M_head_impl,
             (unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> *)&local_340);
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_350);
    if (local_310 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_310->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_350._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_350._M_head_impl + 8))();
    }
  }
  if (local_310 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_340._M_head_impl)->_vptr_IRom)->_M_allocated_capacity + 8))();
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Nrom, creation_works_with_correct_rom_sizes) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom{RomFactory::from_bytes(ss)};
    EXPECT_NE(nullptr, nrom);

    bytes = nrom_bytes(2, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    nrom = RomFactory::from_bytes(ss);
    EXPECT_NE(nullptr, nrom);
}